

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_dynamic_suite::dynamic_front(void)

{
  initializer_list<int> input;
  reference piVar1;
  undefined4 local_6c [2];
  undefined4 local_64 [2];
  undefined4 local_5c [2];
  int local_54 [3];
  iterator local_48;
  undefined8 local_40;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  local_54[0] = 0xb;
  local_54[1] = 0x16;
  local_54[2] = 0x21;
  local_48 = local_54;
  local_40 = 3;
  input._M_len = 3;
  input._M_array = local_48;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5c[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd2,"void api_dynamic_suite::dynamic_front()",piVar1,local_5c);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x2c);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_64[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd4,"void api_dynamic_suite::dynamic_front()",piVar1,local_64);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::front
                     ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_6c[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd6,"void api_dynamic_suite::dynamic_front()",piVar1,local_6c);
  return;
}

Assistant:

void dynamic_front()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33};
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(44);
    BOOST_TEST_EQ(span.front(), 11);
    span.push_back(55);
    BOOST_TEST_EQ(span.front(), 22);
}